

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expendable.cpp
# Opt level: O3

int __thiscall DIS::Expendable::getMarshalledSize(Expendable *this)

{
  int iVar1;
  
  iVar1 = EntityType::getMarshalledSize(&this->_expendable);
  return iVar1 + 8;
}

Assistant:

int Expendable::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + _expendable.getMarshalledSize();  // _expendable
   marshalSize = marshalSize + 4;  // _station
   marshalSize = marshalSize + 2;  // _quantity
   marshalSize = marshalSize + 1;  // _expendableStatus
   marshalSize = marshalSize + 1;  // _padding
    return marshalSize;
}